

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

BinaryEventExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryEventExpressionSyntax,slang::syntax::BinaryEventExpressionSyntax_const&>
          (BumpAllocator *this,BinaryEventExpressionSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  EventExpressionSyntax *pEVar3;
  Info *pIVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  SyntaxKind SVar8;
  undefined4 uVar9;
  BinaryEventExpressionSyntax *pBVar10;
  
  pBVar10 = (BinaryEventExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinaryEventExpressionSyntax *)this->endPtr < pBVar10 + 1) {
    pBVar10 = (BinaryEventExpressionSyntax *)allocateSlow(this,0x38,8);
  }
  else {
    this->head->current = (byte *)(pBVar10 + 1);
  }
  (pBVar10->right).ptr = (args->right).ptr;
  SVar8 = (args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.kind;
  uVar9 = *(undefined4 *)
           &(args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.parent;
  pSVar2 = (args->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.previewNode
  ;
  pEVar3 = (args->left).ptr;
  uVar5 = (args->operatorToken).field_0x2;
  NVar6.raw = (args->operatorToken).numFlags.raw;
  uVar7 = (args->operatorToken).rawLen;
  pIVar4 = (args->operatorToken).info;
  (pBVar10->operatorToken).kind = (args->operatorToken).kind;
  (pBVar10->operatorToken).field_0x2 = uVar5;
  (pBVar10->operatorToken).numFlags = (NumericTokenFlags)NVar6.raw;
  (pBVar10->operatorToken).rawLen = uVar7;
  (pBVar10->operatorToken).info = pIVar4;
  (pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.previewNode =
       pSVar2;
  (pBVar10->left).ptr = pEVar3;
  (pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.kind = SVar8;
  *(undefined4 *)
   &(pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.field_0x4 =
       uVar9;
  (pBVar10->super_EventExpressionSyntax).super_SequenceExprSyntax.super_SyntaxNode.parent = pSVar1;
  return pBVar10;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }